

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O1

int GetScanDataResponseRPLIDAR
              (RPLIDAR *pRPLIDAR,double *pDistance,double *pAngle,BOOL *pbNewScan,int *pQuality)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  double dVar4;
  int iVar5;
  ssize_t sVar6;
  __time_t _Var7;
  long lVar8;
  long *plVar9;
  uint uVar10;
  byte *pbVar11;
  ulong uVar12;
  char *pcVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  size_t __n;
  CHRONO chrono;
  uchar recvbuf [1024];
  timespec local_4a8;
  double *local_498;
  double *local_490;
  uint *local_488;
  timespec local_480;
  undefined8 local_470;
  undefined8 uStack_468;
  long local_460;
  long lStack_458;
  timespec local_450;
  int local_440;
  byte local_438 [1032];
  
  local_498 = pDistance;
  local_490 = pAngle;
  local_488 = (uint *)pQuality;
  iVar5 = clock_getres(4,&local_450);
  if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_480), iVar5 == 0)) {
    local_440 = 0;
    local_470 = 0;
    uStack_468 = 0;
    local_460 = 0;
    lStack_458 = 0;
  }
  uVar12 = 0;
  memset(local_438,0,0x400);
  iVar5 = (pRPLIDAR->RS232Port).DevType;
  iVar14 = 1;
  if (iVar5 - 1U < 4) {
    iVar5 = (pRPLIDAR->RS232Port).s;
    do {
      sVar6 = recv(iVar5,local_438 + uVar12,(long)(5 - (int)uVar12),0);
      if ((int)sVar6 < 1) goto LAB_001a9c35;
      uVar16 = (int)uVar12 + (int)sVar6;
      uVar12 = (ulong)uVar16;
    } while ((int)uVar16 < 5);
  }
  else {
    if (iVar5 != 0) {
      pcVar13 = "Error reading data from a RPLIDAR. ";
      goto LAB_001a9c50;
    }
    iVar5 = *(int *)&(pRPLIDAR->RS232Port).hDev;
    uVar12 = 0;
    do {
      sVar6 = read(iVar5,local_438 + uVar12,(ulong)(5 - (int)uVar12));
      if ((int)sVar6 < 1) goto LAB_001a9c35;
      uVar16 = (int)uVar12 + (int)sVar6;
      uVar12 = (ulong)uVar16;
    } while (uVar16 < 5);
  }
  iVar5 = 5;
  do {
    uVar16 = 0;
    pbVar11 = local_438;
    do {
      if ((int)(iVar5 - uVar16) < 5) {
        uVar10 = 5 - (iVar5 - uVar16);
        iVar14 = 6;
        lVar8 = 0;
      }
      else {
        bVar1 = *pbVar11;
        *pbNewScan = bVar1 & 1;
        if ((bVar1 >> 1 & 1) == (byte)(bVar1 & 1)) {
          pcVar13 = "Warning : RPLIDAR bad inversed start bit. ";
        }
        else {
          bVar2 = pbVar11[1];
          if ((bVar2 & 1) != 0) {
            *local_488 = (uint)(bVar1 >> 2);
            uVar3 = *(ushort *)(pbVar11 + 3);
            dVar4 = fmod(((double)(int)-((uint)(bVar2 >> 1) | (uint)pbVar11[2] << 7) * 0.015625 *
                         3.141592653589793) / 180.0,6.283185307179586);
            dVar4 = fmod(dVar4 + 9.42477796076938,6.283185307179586);
            *local_490 = dVar4 + -3.141592653589793;
            *local_498 = (double)uVar3 / 4000.0;
            lVar8 = 0;
            uVar10 = 0xffffffff;
            iVar14 = 0;
            goto LAB_001a9a2d;
          }
          pcVar13 = "Warning : RPLIDAR bad check bit. ";
        }
        puts(pcVar13);
        lVar8 = 1;
        uVar10 = 0xffffffff;
        iVar14 = 1;
      }
LAB_001a9a2d:
      uVar15 = 0xffffffff;
      if ((iVar14 == 0) || (uVar15 = uVar10, iVar14 == 6)) goto LAB_001a9a57;
      pbVar11 = pbVar11 + lVar8;
      uVar16 = uVar16 + (int)lVar8;
    } while ((int)uVar16 < iVar5);
    iVar14 = 1;
    uVar15 = 0xffffffff;
LAB_001a9a57:
    if (iVar14 == 1) {
      uVar15 = 5;
      if ((int)uVar16 < 5) {
        uVar15 = uVar16;
      }
    }
    else if (iVar14 == 0) {
      if ((int)(iVar5 - uVar16) < 6) {
        return 0;
      }
      pcVar13 = "Warning getting data from a RPLIDAR : Unexpected data after a data response. ";
      iVar14 = 0;
      goto LAB_001a9c50;
    }
    __n = (size_t)(int)(iVar5 - uVar16);
    memmove(local_438,local_438 + (int)uVar16,__n);
    iVar5 = (iVar5 - uVar16) + uVar15;
    if (0x3ff < iVar5) {
      iVar14 = 4;
      pcVar13 = "Error reading data from a RPLIDAR : Invalid data. ";
      goto LAB_001a9c50;
    }
    iVar14 = (pRPLIDAR->RS232Port).DevType;
    if (iVar14 - 1U < 4) {
      if (0 < (int)uVar15) {
        iVar14 = (pRPLIDAR->RS232Port).s;
        uVar12 = 0;
        do {
          sVar6 = recv(iVar14,local_438 + uVar12 + __n,(long)(int)(uVar15 - (int)uVar12),0);
          if ((int)sVar6 < 1) goto LAB_001a9c3e;
          uVar16 = (int)uVar12 + (int)sVar6;
          uVar12 = (ulong)uVar16;
        } while ((int)uVar16 < (int)uVar15);
      }
    }
    else {
      if (iVar14 != 0) {
LAB_001a9c3e:
        pcVar13 = "Error reading data from a RPLIDAR. ";
        iVar14 = 1;
        goto LAB_001a9c50;
      }
      if (uVar15 != 0) {
        iVar14 = *(int *)&(pRPLIDAR->RS232Port).hDev;
        uVar12 = 0;
        do {
          sVar6 = read(iVar14,local_438 + uVar12 + __n,(ulong)(uVar15 - (int)uVar12));
          if ((int)sVar6 < 1) goto LAB_001a9c3e;
          uVar16 = (int)uVar12 + (int)sVar6;
          uVar12 = (ulong)uVar16;
        } while (uVar16 < uVar15);
      }
    }
    if (local_440 == 0) {
      clock_gettime(4,&local_4a8);
      local_4a8.tv_sec =
           (local_4a8.tv_sec + local_460 + (local_4a8.tv_nsec + lStack_458) / 1000000000) -
           local_480.tv_sec;
      local_4a8.tv_nsec = (local_4a8.tv_nsec + lStack_458) % 1000000000 - local_480.tv_nsec;
      if (local_4a8.tv_nsec < 0) {
        local_4a8.tv_sec = local_4a8.tv_sec + local_4a8.tv_nsec / 1000000000 + -1;
        local_4a8.tv_nsec = local_4a8.tv_nsec % 1000000000 + 1000000000;
      }
      plVar9 = &local_4a8.tv_nsec;
      _Var7 = local_4a8.tv_sec;
    }
    else {
      plVar9 = &lStack_458;
      _Var7 = local_460;
    }
  } while ((double)*plVar9 / 1000000000.0 + (double)_Var7 <= 4.0);
  iVar14 = 2;
  pcVar13 = "Error reading data from a RPLIDAR : Data response timeout. ";
LAB_001a9c50:
  puts(pcVar13);
  return iVar14;
LAB_001a9c35:
  pcVar13 = "Error reading data from a RPLIDAR. ";
  goto LAB_001a9c50;
}

Assistant:

inline int GetScanDataResponseRPLIDAR(RPLIDAR* pRPLIDAR, double* pDistance, double* pAngle, BOOL* pbNewScan, int* pQuality)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
#if !defined(FORCE_RPLIDAR_SDK_V1) || defined(SLAMTEC_LIDAR_SDK_VERSION)
	sl_lidar_response_measurement_node_hq_t nodes[1+MAX_NB_MEASUREMENTS_PER_SCAN_RPLIDAR];
#else
	sl_lidar_response_measurement_node_hq_t nodes[1];
#endif // !defined(FORCE_RPLIDAR_SDK_V1) || defined(SLAMTEC_LIDAR_SDK_VERSION)
	size_t nodesCount = sizeof(nodes)/sizeof(sl_lidar_response_measurement_node_hq_t);
	size_t nodesRead = 0;
	int nbMeasurements = 1, j = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	if (!pRPLIDAR->nodes_cache->empty())
	{
		for (j = 0; j < min(nbMeasurements, (int)pRPLIDAR->nodes_cache->size()); j++)
		{
			nodes[j] = pRPLIDAR->nodes_cache->front();
			pRPLIDAR->nodes_cache->pop_front();
		}
		nodesRead = min(nbMeasurements, (int)pRPLIDAR->nodes_cache->size());
	}
	while ((int)nodesRead < nbMeasurements)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > pRPLIDAR->timeout)
		{
			printf("A RPLIDAR is not responding correctly : getScanDataWithIntervalHq() timeout. \n");
			return EXIT_TIMEOUT;
		}
		nodesCount = nbMeasurements-nodesRead;
		if (SL_IS_FAIL(pRPLIDAR->drv->getScanDataWithIntervalHq(nodes+nodesRead, nodesCount)))
		{
			uSleep(1000);
		}
		else nodesRead += nodesCount;
	}
	if ((int)nodesRead > nbMeasurements)
	{
		for (j = nbMeasurements; j < (int)nodesRead; j++)
		{
			pRPLIDAR->nodes_cache->push_back(nodes[j]);
		}
	}

	// Analyze the data response.
	*pbNewScan = (nodes[0].flag & SL_LIDAR_RESP_MEASUREMENT_SYNCBIT);
	*pQuality = (unsigned char)(nodes[0].quality);

	// Convert in rad.
	*pAngle = fmod_2PI_deg2rad(-nodes[0].angle_z_q14*90.0/(1 << 14));

	// Convert in m.
	*pDistance = nodes[0].dist_mm_q2/4000.0;
#else
	unsigned char recvbuf[MAX_NB_BYTES_RPLIDAR];
	int BytesReceived = 0, recvbuflen = 0, res = EXIT_FAILURE, nbBytesToRequest = 0, nbBytesDiscarded = 0;
	unsigned char* ptr = NULL;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_RPLIDAR-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired data response...

	nbBytesToRequest = NB_BYTES_SCAN_DATA_RESPONSE_RPLIDAR;
	if (ReadAllRS232Port(&pRPLIDAR->RS232Port, recvbuf, nbBytesToRequest) != EXIT_SUCCESS)
	{
		printf("Error reading data from a RPLIDAR. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += nbBytesToRequest;
	
	for (;;)
	{
		res = FindScanDataResponseRPLIDAR(recvbuf, BytesReceived, pbNewScan, pQuality, pAngle, pDistance, &nbBytesToRequest, &ptr, &nbBytesDiscarded);
		if (res == EXIT_SUCCESS) break;
		if (res == EXIT_FAILURE)
		{
			nbBytesToRequest = min(NB_BYTES_SCAN_DATA_RESPONSE_RPLIDAR, nbBytesDiscarded);
		}	
		memmove(recvbuf, recvbuf+nbBytesDiscarded, BytesReceived-nbBytesDiscarded);
		BytesReceived -= nbBytesDiscarded;
		if (BytesReceived+nbBytesToRequest > recvbuflen)
		{
			printf("Error reading data from a RPLIDAR : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&pRPLIDAR->RS232Port, recvbuf+BytesReceived, nbBytesToRequest) != EXIT_SUCCESS)
		{
			printf("Error reading data from a RPLIDAR. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += nbBytesToRequest;
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_RPLIDAR)
		{
			printf("Error reading data from a RPLIDAR : Data response timeout. \n");
			return EXIT_TIMEOUT;
		}
	}

	if (BytesReceived-nbBytesDiscarded-NB_BYTES_SCAN_DATA_RESPONSE_RPLIDAR > 0)
	{
		printf("Warning getting data from a RPLIDAR : Unexpected data after a data response. \n");
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}